

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O0

df_iterator * __thiscall
spvtools::opt::DominatorTreeNode::df_end
          (df_iterator *__return_storage_ptr__,DominatorTreeNode *this)

{
  DominatorTreeNode *this_local;
  
  TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

df_iterator df_end() { return df_iterator(); }